

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall cfd::core::Psbt::Sign(Psbt *this,Privkey *privkey,bool has_grind_r)

{
  CfdException *this_00;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  int local_5c;
  undefined1 local_58 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  Privkey::GetData((ByteData *)local_58,privkey);
  ByteData::GetBytes(&local_38,(ByteData *)local_58);
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_);
  }
  local_5c = wally_psbt_sign(this->wally_psbt_pointer_,
                             local_38.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             (long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(ulong)has_grind_r << 2
                            );
  if (local_5c == 0) {
    if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_58._0_8_ = "cfdcore_psbt.cpp";
  local_58._8_4_ = 0x85f;
  local_58._16_8_ = "Sign";
  logger::log<int&>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"wally_psbt_sign NG[{}]",
                    &local_5c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"psbt sign error.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::Sign(const Privkey &privkey, bool has_grind_r) {
  std::vector<uint8_t> key = privkey.GetData().GetBytes();
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  int ret = wally_psbt_sign(
      psbt_pointer, key.data(), key.size(),
      (has_grind_r) ? EC_FLAG_GRIND_R : 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_sign NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt sign error.");
  }
}